

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::Imputer::_InternalParse(Imputer *this,char *ptr,ParseContext *ctx)

{
  ImputedValueUnion *pIVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  StringToDoubleMap *msg;
  string *psVar6;
  uint32_t uVar7;
  undefined8 *puVar8;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *pAVar9;
  internal *this_00;
  char cVar10;
  uint res;
  int64_t iVar11;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  StringPiece str;
  byte *local_50;
  InternalMetadata *local_48;
  int64_t local_40;
  ReplaceValueUnion *local_38;
  
  local_50 = (byte *)ptr;
  bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  if (!bVar5) {
    local_38 = &this->ReplaceValue_;
    local_48 = &(this->super_MessageLite)._internal_metadata_;
    pIVar1 = &this->ImputedValue_;
    do {
      bVar2 = *local_50;
      res = (uint)bVar2;
      p = local_50 + 1;
      if ((char)bVar2 < '\0') {
        res = ((uint)bVar2 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar12 = google::protobuf::internal::ReadTagFallback((char *)local_50,res);
          p = (byte *)pVar12.first;
          res = pVar12.second;
        }
        else {
          p = local_50 + 2;
        }
      }
      cVar10 = (char)res;
      local_50 = p;
      switch(res >> 3) {
      case 1:
        if (cVar10 != '\t') break;
        iVar11 = *(int64_t *)p;
        if (this->_oneof_case_[0] != 1) {
          local_40 = *(int64_t *)p;
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 1;
          iVar11 = local_40;
        }
        pIVar1->imputedint64value_ = iVar11;
LAB_0020007f:
        local_50 = local_50 + 8;
        goto LAB_00200257;
      case 2:
        if (cVar10 != '\x10') break;
        bVar2 = *p;
        pVar13.second = (long)(char)bVar2;
        pVar13.first = (char *)(p + 1);
        if ((long)(char)bVar2 < 0) {
          bVar3 = p[1];
          uVar7 = ((uint)bVar3 * 0x80 + (uint)bVar2) - 0x80;
          if ((char)bVar3 < '\0') {
            pVar13 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
          }
          else {
            pVar13.second._0_4_ = uVar7;
            pVar13.first = (char *)(p + 2);
            pVar13.second._4_4_ = 0;
          }
        }
        local_50 = (byte *)pVar13.first;
        if (this->_oneof_case_[0] != 2) {
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 2;
        }
        pIVar1->imputedint64value_ = pVar13.second;
        goto joined_r0x0020017e;
      case 3:
        if (cVar10 == '\x1a') {
          if (this->_oneof_case_[0] != 3) {
            clear_ImputedValue(this);
            this->_oneof_case_[0] = 3;
            (this->ImputedValue_).imputeddoublevalue_ =
                 (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
          }
          puVar8 = (undefined8 *)(local_48->ptr_ & 0xfffffffffffffffc);
          if ((local_48->ptr_ & 1U) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          psVar6 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                             ((ArenaStringPtr *)pIVar1,puVar8);
          local_50 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (psVar6,(char *)local_50,ctx);
          this_00 = (internal *)(psVar6->_M_dataplus)._M_p;
          size = psVar6->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
LAB_00200164:
          str.length_ = 0;
          str.ptr_ = (char *)size;
          bVar5 = google::protobuf::internal::VerifyUTF8(this_00,str,(char *)p);
          if (!bVar5) {
            return (char *)0x0;
          }
          goto joined_r0x0020017e;
        }
        break;
      case 4:
        if (cVar10 == '\"') {
          if (this->_oneof_case_[0] != 4) {
            clear_ImputedValue(this);
            this->_oneof_case_[0] = 4;
            uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar9 = (Arena *)(uVar4 & 0xfffffffffffffffc);
            if ((uVar4 & 1) != 0) {
              pAVar9 = *(Arena **)pAVar9;
            }
            msg = (StringToDoubleMap *)
                  google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::DoubleVector>
                            (pAVar9);
            goto LAB_00200232;
          }
LAB_002000e0:
          msg = (StringToDoubleMap *)pIVar1->imputeddoublearray_;
LAB_0020023e:
          local_50 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,&msg->super_MessageLite,(char *)local_50);
          goto joined_r0x0020017e;
        }
        break;
      case 5:
        if (cVar10 == '*') {
          if (this->_oneof_case_[0] == 5) goto LAB_002000e0;
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 5;
          uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar9 = (Arena *)(uVar4 & 0xfffffffffffffffc);
          if ((uVar4 & 1) != 0) {
            pAVar9 = *(Arena **)pAVar9;
          }
          msg = (StringToDoubleMap *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                          (pAVar9);
LAB_00200232:
          pIVar1->imputedint64dictionary_ = (Int64ToDoubleMap *)msg;
          goto LAB_0020023e;
        }
        break;
      case 6:
        if (cVar10 == '2') {
          if (this->_oneof_case_[0] == 6) goto LAB_002000e0;
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 6;
          uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar9 = (Arena *)(uVar4 & 0xfffffffffffffffc);
          if ((uVar4 & 1) != 0) {
            pAVar9 = *(Arena **)pAVar9;
          }
          msg = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::StringToDoubleMap>(pAVar9);
          goto LAB_00200232;
        }
        break;
      case 7:
        if (cVar10 == ':') {
          if (this->_oneof_case_[0] == 7) goto LAB_002000e0;
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 7;
          uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar9 = (Arena *)(uVar4 & 0xfffffffffffffffc);
          if ((uVar4 & 1) != 0) {
            pAVar9 = *(Arena **)pAVar9;
          }
          msg = (StringToDoubleMap *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64ToDoubleMap>
                          (pAVar9);
          goto LAB_00200232;
        }
        break;
      case 0xb:
        if (cVar10 == 'Y') {
          iVar11 = *(int64_t *)p;
          if (this->_oneof_case_[1] != 0xb) {
            local_40 = *(int64_t *)p;
            clear_ReplaceValue(this);
            this->_oneof_case_[1] = 0xb;
            iVar11 = local_40;
          }
          local_38->replaceint64value_ = iVar11;
          goto LAB_0020007f;
        }
        break;
      case 0xc:
        if (cVar10 == '`') {
          bVar2 = *p;
          pVar14.second = (long)(char)bVar2;
          pVar14.first = (char *)(p + 1);
          if ((long)(char)bVar2 < 0) {
            bVar3 = p[1];
            uVar7 = ((uint)bVar3 * 0x80 + (uint)bVar2) - 0x80;
            if ((char)bVar3 < '\0') {
              pVar14 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
            }
            else {
              pVar14.second._0_4_ = uVar7;
              pVar14.first = (char *)(p + 2);
              pVar14.second._4_4_ = 0;
            }
          }
          local_50 = (byte *)pVar14.first;
          if (this->_oneof_case_[1] != 0xc) {
            clear_ReplaceValue(this);
            this->_oneof_case_[1] = 0xc;
          }
          local_38->replaceint64value_ = pVar14.second;
          goto joined_r0x0020017e;
        }
        break;
      case 0xd:
        if (cVar10 == 'j') {
          if (this->_oneof_case_[1] != 0xd) {
            clear_ReplaceValue(this);
            this->_oneof_case_[1] = 0xd;
            (this->ReplaceValue_).replacedoublevalue_ =
                 (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
          }
          puVar8 = (undefined8 *)(local_48->ptr_ & 0xfffffffffffffffc);
          if ((local_48->ptr_ & 1U) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          psVar6 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                             ((ArenaStringPtr *)local_38,puVar8);
          local_50 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (psVar6,(char *)local_50,ctx);
          this_00 = (internal *)(psVar6->_M_dataplus)._M_p;
          size = psVar6->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
          goto LAB_00200164;
        }
      }
      if ((res == 0) || ((res & 7) == 4)) {
        if (p == (byte *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)p;
      }
      if ((local_48->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_48);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_48->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_50 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (res,unknown,(char *)local_50,ctx);
joined_r0x0020017e:
      if (local_50 == (byte *)0x0) {
        return (char *)0x0;
      }
LAB_00200257:
      bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
    } while (!bVar5);
  }
  return (char *)local_50;
}

Assistant:

const char* Imputer::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // double imputedDoubleValue = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 9)) {
          _internal_set_imputeddoublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // int64 imputedInt64Value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _internal_set_imputedint64value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string imputedStringValue = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          auto str = _internal_mutable_imputedstringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputeddoublearray(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedint64array(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 50)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedstringdictionary(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedint64dictionary(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double replaceDoubleValue = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 89)) {
          _internal_set_replacedoublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // int64 replaceInt64Value = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 96)) {
          _internal_set_replaceint64value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string replaceStringValue = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_replacestringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}